

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_UTF8Reader.cpp
# Opt level: O1

UTF8Reader * __thiscall soul::UTF8Reader::operator++(UTF8Reader *this)

{
  byte bVar1;
  byte *pbVar2;
  char *pcVar3;
  uint uVar4;
  
  pbVar2 = (byte *)this->data;
  if (*pbVar2 == 0) {
    throwInternalCompilerError("*data != 0","operator++",0x52);
  }
  this->data = (char *)(pbVar2 + 1);
  bVar1 = *pbVar2;
  if ((bVar1 & 0x40) != 0 && (char)bVar1 < '\0') {
    pcVar3 = this->data;
    uVar4 = 0x40;
    do {
      pcVar3 = pcVar3 + 1;
      if (uVar4 < 0x12) break;
      uVar4 = uVar4 >> 1;
    } while ((uVar4 & bVar1) != 0);
    this->data = pcVar3;
  }
  return this;
}

Assistant:

UTF8Reader& UTF8Reader::operator++()
{
    SOUL_ASSERT (*data != 0); // trying to advance past the end of the string?
    auto n = (signed char) *data++;

    if (n < 0)
    {
        uint32_t bit = 0x40;

        while ((static_cast<uint32_t> (n) & bit) != 0 && bit > 0x8)
        {
            ++data;
            bit >>= 1;
        }
    }

    return *this;
}